

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

int __thiscall phyr::AccelBVH::flattenBVH(AccelBVH *this,BVHTreeNode *treeNode,int *linearIdx)

{
  int iVar1;
  int iVar2;
  int *linearIdx_00;
  BVHTreeNode *in_RDX;
  AccelBVH *in_RSI;
  long in_RDI;
  int currentIdx;
  LinearBVHNode *linearNode;
  
  linearIdx_00 = (int *)(*(long *)(in_RDI + 0x28) + (long)*(int *)&(in_RDX->bounds).pMin.x * 0x38);
  memcpy(linearIdx_00,in_RSI,0x30);
  iVar1 = *(int *)&(in_RDX->bounds).pMin.x;
  *(int *)&(in_RDX->bounds).pMin.x = iVar1 + 1;
  if (*(int *)&in_RSI[1].objectList.
               super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
               ._M_impl.super__Vector_impl_data._M_finish < 1) {
    *(undefined2 *)(linearIdx_00 + 0xd) = 0;
    *(char *)((long)linearIdx_00 + 0x36) =
         (char)*(undefined4 *)
                &in_RSI[1].objectList.
                 super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    flattenBVH(in_RSI,in_RDX,linearIdx_00);
    iVar2 = flattenBVH(in_RSI,in_RDX,linearIdx_00);
    linearIdx_00[0xc] = iVar2;
  }
  else {
    linearIdx_00[0xc] =
         *(int *)((long)&in_RSI[1].objectList.
                         super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
    *(short *)(linearIdx_00 + 0xd) =
         (short)*(undefined4 *)
                 &in_RSI[1].objectList.
                  super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
  }
  return iVar1;
}

Assistant:

int AccelBVH::flattenBVH(BVHTreeNode* treeNode, int* linearIdx) {
    // Copy data from tree node
    LinearBVHNode* linearNode = &bvhNodes[*linearIdx];

    linearNode->bounds = treeNode->bounds;
    int currentIdx = (*linearIdx)++;

    // If tree node is a leaf
    if (treeNode->nObjects > 0) {
        linearNode->objectStartIdx = treeNode->startIdx;
        linearNode->nObjects = treeNode->nObjects;
    } else {
        linearNode->nObjects = 0;
        linearNode->splitAxis = treeNode->splitAxis;
        // Recursive traverse left child
        flattenBVH(treeNode->child[0], linearIdx);
        // Store index of right child with a recursive call
        linearNode->secondChildIdx = flattenBVH(treeNode->child[1], linearIdx);
    }

    return currentIdx;
}